

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
HBF::heuristic_nhh_euclidean
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<int,_std::allocator<int>_> *goal)

{
  size_type sVar1;
  reference pvVar2;
  size_type __n;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  int iVar5;
  __type _Var6;
  __type _Var7;
  double dVar8;
  int local_70;
  int local_6c;
  int j;
  int i;
  allocator<double> local_51;
  value_type_conflict1 local_50;
  vector<double,_std::allocator<double>_> local_48;
  undefined1 local_29;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *goal_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *grid_local;
  HBF *this_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *heuristic;
  
  local_29 = 0;
  local_28 = goal;
  goal_local = (vector<int,_std::allocator<int>_> *)grid;
  grid_local = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)this;
  this_local = (HBF *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(grid);
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](grid,0);
  __n = std::vector<int,_std::allocator<int>_>::size(pvVar2);
  local_50 = 0.0;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,&local_50,&local_51);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,sVar1,&local_48,
           (allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::vector<double,_std::allocator<double>_>::~vector(&local_48);
  std::allocator<double>::~allocator(&local_51);
  for (local_6c = 0;
      sVar1 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(grid), (ulong)(long)local_6c < sVar1; local_6c = local_6c + 1) {
    local_70 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](grid,0);
      sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
      if (sVar1 <= (ulong)(long)local_70) break;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](goal,1);
      iVar5 = local_6c - *pvVar3;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      _Var6 = std::pow<int,int>(iVar5,2);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](goal,0);
      iVar5 = local_70 - *pvVar3;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      _Var7 = std::pow<int,int>(iVar5,2);
      dVar8 = sqrt(_Var6 + _Var7);
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](__return_storage_ptr__,(long)local_6c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_70);
      *pvVar4 = dVar8;
      local_70 = local_70 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double> > HBF::heuristic_nhh_euclidean(vector<vector<int> > grid, vector<int> goal){
    /*
    Create the heuristic function for non-holonomic heuristic, which does not consider obstacles.
    A simple implementation that doesn't consider different trajectories at different points in cell.
    */

    vector<vector<double> > heuristic(grid.size(), vector<double>(grid[0].size(), 0));

    // give obstacles a very large value
    for (int i = 0; i < grid.size(); i ++){
        for (int j = 0; j < grid[0].size(); j ++){
            heuristic[i][j] = sqrt(pow(abs(i-goal[1]),2)+pow(abs(j-goal[0]),2));
        }
    }

    return heuristic;

}